

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O0

void av1_quantize_lp_sse2
               (int16_t *coeff_ptr,intptr_t n_coeffs,int16_t *round_ptr,int16_t *quant_ptr,
               int16_t *qcoeff_ptr,int16_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,
               int16_t *scan,int16_t *iscan)

{
  int16_t iVar1;
  int16_t *in_RCX;
  intptr_t in_RDX;
  long in_RSI;
  __m128i *round0_00;
  __m128i *round0_01;
  long in_RDI;
  long lVar2;
  __m128i eob_00;
  int16_t *in_stack_00000008;
  int16_t *in_stack_00000010;
  long in_stack_00000020;
  __m128i eob;
  __m128i dequant1;
  __m128i dequant0;
  __m128i quant1;
  __m128i quant0;
  __m128i round1;
  __m128i round0;
  __m128i *in_stack_00000370;
  __m128i *in_stack_00000378;
  __m128i *in_stack_00000380;
  __m128i *in_stack_00000388;
  __m128i *in_stack_00000390;
  __m128i *in_stack_00000398;
  undefined4 uStack_11c;
  long local_b0;
  __m128i *palVar3;
  int16_t *coeff_ptr_00;
  undefined4 in_stack_ffffffffffffff80;
  
  round0_00 = (__m128i *)(in_RDI + in_RSI * 2);
  lVar2 = in_stack_00000020 + in_RSI * 2;
  local_b0 = -in_RSI;
  coeff_ptr_00 = *(int16_t **)in_stack_00000008;
  uStack_11c = (undefined4)((ulong)*(undefined8 *)(in_stack_00000008 + 4) >> 0x20);
  in_stack_00000020 = lVar2;
  round0_01 = round0_00;
  quantize_lp((int16_t *)CONCAT44(uStack_11c,in_stack_ffffffffffffff80),coeff_ptr_00,in_RDX,in_RCX,
              in_stack_00000008,round0_00,in_stack_00000370,in_stack_00000378,in_stack_00000380,
              in_stack_00000388,in_stack_00000390,in_stack_00000398);
  while (local_b0 = local_b0 + 0x10, local_b0 < 0) {
    lVar2 = in_stack_00000020;
    palVar3 = round0_01;
    quantize_lp((int16_t *)CONCAT44(uStack_11c,in_stack_ffffffffffffff80),coeff_ptr_00,in_RDX,in_RCX
                ,in_stack_00000008,round0_01,in_stack_00000370,in_stack_00000378,in_stack_00000380,
                in_stack_00000388,in_stack_00000390,in_stack_00000398);
    round0_00 = round0_01;
    round0_01 = palVar3;
  }
  eob_00[1] = (longlong)round0_00;
  eob_00[0] = lVar2;
  iVar1 = accumulate_eob(eob_00);
  *in_stack_00000010 = iVar1;
  return;
}

Assistant:

void av1_quantize_lp_sse2(const int16_t *coeff_ptr, intptr_t n_coeffs,
                          const int16_t *round_ptr, const int16_t *quant_ptr,
                          int16_t *qcoeff_ptr, int16_t *dqcoeff_ptr,
                          const int16_t *dequant_ptr, uint16_t *eob_ptr,
                          const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  coeff_ptr += n_coeffs;
  iscan += n_coeffs;
  qcoeff_ptr += n_coeffs;
  dqcoeff_ptr += n_coeffs;
  n_coeffs = -n_coeffs;

  // Setup global values
  const __m128i round0 = _mm_load_si128((const __m128i *)round_ptr);
  const __m128i round1 = _mm_unpackhi_epi64(round0, round0);
  const __m128i quant0 = _mm_load_si128((const __m128i *)quant_ptr);
  const __m128i quant1 = _mm_unpackhi_epi64(quant0, quant0);
  const __m128i dequant0 = _mm_load_si128((const __m128i *)dequant_ptr);
  const __m128i dequant1 = _mm_unpackhi_epi64(dequant0, dequant0);
  __m128i eob = _mm_setzero_si128();

  // DC and first 15 AC
  quantize_lp(iscan, coeff_ptr, n_coeffs, qcoeff_ptr, dqcoeff_ptr, &round0,
              &round1, &quant0, &quant1, &dequant0, &dequant1, &eob);
  n_coeffs += 8 * 2;

  // AC only loop
  while (n_coeffs < 0) {
    quantize_lp(iscan, coeff_ptr, n_coeffs, qcoeff_ptr, dqcoeff_ptr, &round1,
                &round1, &quant1, &quant1, &dequant1, &dequant1, &eob);
    n_coeffs += 8 * 2;
  }

  // Accumulate EOB
  *eob_ptr = accumulate_eob(eob);
}